

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O2

void testDefault(TA_FuncInfo *funcInfo,void *opaqueData)

{
  __int32_t *p_Var1;
  ErrorNumber EVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char *pcVar6;
  
  if (*opaqueData != 0) {
    return;
  }
  pcVar6 = funcInfo->group;
  sVar3 = strlen(pcVar6);
  if (sVar3 < 4) {
LAB_0011db17:
    EVar2 = callWithDefaults(funcInfo->name,inputNegData,inputNegData_int,100);
    *(ErrorNumber *)opaqueData = EVar2;
    pcVar6 = funcInfo->name;
    if (EVar2 != TA_TEST_PASS) {
      pcVar5 = "inputNegData";
      goto LAB_0011dc25;
    }
    EVar2 = callWithDefaults(pcVar6,inputZeroData,inputZeroData_int,100);
    *(ErrorNumber *)opaqueData = EVar2;
    pcVar6 = funcInfo->name;
    if (EVar2 != TA_TEST_PASS) {
      pcVar5 = "inputZeroData";
      goto LAB_0011dc25;
    }
    EVar2 = callWithDefaults(pcVar6,inputRandFltEpsilon,inputRandFltEpsilon_int,100);
    *(ErrorNumber *)opaqueData = EVar2;
    pcVar6 = funcInfo->name;
    if (EVar2 != TA_TEST_PASS) {
      pcVar5 = "inputRandFltEpsilon";
      goto LAB_0011dc25;
    }
    EVar2 = callWithDefaults(pcVar6,inputRandDblEpsilon,inputRandDblEpsilon_int,100);
    *(ErrorNumber *)opaqueData = EVar2;
    if (EVar2 != TA_TEST_PASS) {
      pcVar6 = funcInfo->name;
      pcVar5 = "inputRandDblEpsilon";
      goto LAB_0011dc25;
    }
  }
  else {
    pp_Var4 = __ctype_tolower_loc();
    p_Var1 = *pp_Var4;
    if ((((p_Var1[*pcVar6] != 0x6d) || (p_Var1[pcVar6[1]] != 0x61)) || (p_Var1[pcVar6[2]] != 0x74))
       || (p_Var1[pcVar6[3]] != 0x68)) goto LAB_0011db17;
  }
  EVar2 = callWithDefaults(funcInfo->name,inputRandomData,inputRandomData_int,2000);
  *(ErrorNumber *)opaqueData = EVar2;
  if (EVar2 == TA_TEST_PASS) {
    if (doExtensiveProfiling == 0) {
      return;
    }
    testDefault::nbFunctionDone = testDefault::nbFunctionDone + 1;
    printf("%s ",funcInfo->name);
    EVar2 = callAndProfile(funcInfo->name,PROFILING_100);
    *(ErrorNumber *)opaqueData = EVar2;
    pcVar6 = funcInfo->name;
    if (EVar2 == TA_TEST_PASS) {
      EVar2 = callAndProfile(pcVar6,PROFILING_500);
      *(ErrorNumber *)opaqueData = EVar2;
      pcVar6 = funcInfo->name;
      if (EVar2 == TA_TEST_PASS) {
        EVar2 = callAndProfile(pcVar6,PROFILING_1000);
        *(ErrorNumber *)opaqueData = EVar2;
        pcVar6 = funcInfo->name;
        if (EVar2 == TA_TEST_PASS) {
          EVar2 = callAndProfile(pcVar6,PROFILING_2000);
          *(ErrorNumber *)opaqueData = EVar2;
          pcVar6 = funcInfo->name;
          if (EVar2 == TA_TEST_PASS) {
            EVar2 = callAndProfile(pcVar6,PROFILING_5000);
            *(ErrorNumber *)opaqueData = EVar2;
            pcVar6 = funcInfo->name;
            if (EVar2 == TA_TEST_PASS) {
              EVar2 = callAndProfile(pcVar6,PROFILING_8000);
              *(ErrorNumber *)opaqueData = EVar2;
              pcVar6 = funcInfo->name;
              if (EVar2 == TA_TEST_PASS) {
                EVar2 = callAndProfile(pcVar6,PROFILING_10000);
                *(ErrorNumber *)opaqueData = EVar2;
                if (EVar2 == TA_TEST_PASS) {
                  putchar(10);
                  return;
                }
                pcVar6 = funcInfo->name;
                pcVar5 = "PROFILING_10000";
              }
              else {
                pcVar5 = "PROFILING_8000";
              }
            }
            else {
              pcVar5 = "PROFILING_5000";
            }
          }
          else {
            pcVar5 = "PROFILING_2000";
          }
        }
        else {
          pcVar5 = "PROFILING_1000";
        }
      }
      else {
        pcVar5 = "PROFILING_500";
      }
    }
    else {
      pcVar5 = "PROFILING_100";
    }
  }
  else {
    pcVar6 = funcInfo->name;
    pcVar5 = "inputRandomData";
  }
LAB_0011dc25:
  printf("Failed for [%s][%s]\n",pcVar6,pcVar5);
  return;
}

Assistant:

static void testDefault( const TA_FuncInfo *funcInfo, void *opaqueData )
{
	static int nbFunctionDone = 0;
   ErrorNumber *errorNumber;
   errorNumber = (ErrorNumber *)opaqueData;
   if( *errorNumber != TA_TEST_PASS )
      return;

/*   if( !isCandlePattern(funcInfo) )
	   return;*/

#define CALL(x) { \
	*errorNumber = callWithDefaults( funcInfo->name, x, x##_int, sizeof(x)/sizeof(double) ); \
	if( *errorNumber != TA_TEST_PASS ) { \
	   printf( "Failed for [%s][%s]\n", funcInfo->name, #x ); \
       return; \
	} \
}
   /* Do not test value outside the ]0..1[ domain for the "Math" groups. */
   if( !isMath(funcInfo) )
   {
      CALL( inputNegData );
      CALL( inputZeroData );
      CALL( inputRandFltEpsilon );
      CALL( inputRandDblEpsilon );
   }

   CALL( inputRandomData );

#undef CALL

#define CALL(x) { \
	*errorNumber = callAndProfile( funcInfo->name, x ); \
	if( *errorNumber != TA_TEST_PASS ) { \
	   printf( "Failed for [%s][%s]\n", funcInfo->name, #x ); \
       return; \
	} \
}
   if( doExtensiveProfiling /*&& (nbFunctionDone<5)*/ )
   {
	   nbFunctionDone++;
	   printf( "%s ", funcInfo->name );
       CALL( PROFILING_100 );
       CALL( PROFILING_500 );
	   CALL( PROFILING_1000 );
       CALL( PROFILING_2000 );
       CALL( PROFILING_5000 );
       CALL( PROFILING_8000 );
	   CALL( PROFILING_10000 );
	   printf( "\n" );
   }
}